

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void av1_crc32c_calculator_init(CRC32C *p_crc32c)

{
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  int k;
  int n_1;
  int n;
  uint32_t crc;
  CRC32C *p_crc32c_local;
  
  for (n = 0; n < 0x100; n = n + 1) {
    if ((n & 1U) == 0) {
      local_1c = (uint)n >> 1;
    }
    else {
      local_1c = (uint)n >> 1 ^ 0x82f63b78;
    }
    if ((local_1c & 1) == 0) {
      local_20 = local_1c >> 1;
    }
    else {
      local_20 = local_1c >> 1 ^ 0x82f63b78;
    }
    if ((local_20 & 1) == 0) {
      local_24 = local_20 >> 1;
    }
    else {
      local_24 = local_20 >> 1 ^ 0x82f63b78;
    }
    if ((local_24 & 1) == 0) {
      local_28 = local_24 >> 1;
    }
    else {
      local_28 = local_24 >> 1 ^ 0x82f63b78;
    }
    if ((local_28 & 1) == 0) {
      local_2c = local_28 >> 1;
    }
    else {
      local_2c = local_28 >> 1 ^ 0x82f63b78;
    }
    if ((local_2c & 1) == 0) {
      local_30 = local_2c >> 1;
    }
    else {
      local_30 = local_2c >> 1 ^ 0x82f63b78;
    }
    if ((local_30 & 1) == 0) {
      local_34 = local_30 >> 1;
    }
    else {
      local_34 = local_30 >> 1 ^ 0x82f63b78;
    }
    if ((local_34 & 1) == 0) {
      local_38 = local_34 >> 1;
    }
    else {
      local_38 = local_34 >> 1 ^ 0x82f63b78;
    }
    p_crc32c->table[0][n] = local_38;
  }
  for (n_1 = 0; n_1 < 0x100; n_1 = n_1 + 1) {
    crc = p_crc32c->table[0][n_1];
    for (k = 1; k < 8; k = k + 1) {
      crc = p_crc32c->table[0][crc & 0xff] ^ crc >> 8;
      p_crc32c->table[k][n_1] = crc;
    }
  }
  return;
}

Assistant:

void av1_crc32c_calculator_init(CRC32C *p_crc32c) {
  uint32_t crc;

  for (int n = 0; n < 256; n++) {
    crc = n;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    p_crc32c->table[0][n] = crc;
  }
  for (int n = 0; n < 256; n++) {
    crc = p_crc32c->table[0][n];
    for (int k = 1; k < 8; k++) {
      crc = p_crc32c->table[0][crc & 0xff] ^ (crc >> 8);
      p_crc32c->table[k][n] = crc;
    }
  }
}